

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_single_word_trailing_delim_Test<char>::
WordSplitSVTest_single_word_trailing_delim_Test
          (WordSplitSVTest_single_word_trailing_delim_Test<char> *this)

{
  WordSplitSVTest_single_word_trailing_delim_Test<char> *this_local;
  
  WordSplitSVTest<char>::WordSplitSVTest(&this->super_WordSplitSVTest<char>);
  *(undefined ***)&this->super_WordSplitSVTest<char> =
       &PTR__WordSplitSVTest_single_word_trailing_delim_Test_00822ee0;
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}